

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.h
# Opt level: O0

void __thiscall
InstructionVMGraphContext::InstructionVMGraphContext
          (InstructionVMGraphContext *this,OutputContext *output)

{
  OutputContext *output_local;
  InstructionVMGraphContext *this_local;
  
  this->output = output;
  this->code = (char *)0x0;
  this->depth = 0;
  this->lastStart = (char *)0x0;
  this->lastStartOffset = 0;
  this->lastEndOffset = 0;
  this->showTypes = true;
  this->showFullTypes = false;
  this->showUsers = false;
  this->showComments = true;
  this->showContainers = true;
  this->showSource = false;
  this->showAnnotatedSource = false;
  this->displayAsTree = false;
  return;
}

Assistant:

InstructionVMGraphContext(OutputContext &output): output(output)
	{
		code = 0;

		depth = 0;

		lastStart = 0;
		lastStartOffset = 0;
		lastEndOffset = 0;

		showTypes = true;
		showFullTypes = false;
		showUsers = false;
		showComments = true;
		showContainers = true;
		showSource = false;
		showAnnotatedSource = false;

		displayAsTree = false;
	}